

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# containers.cc
# Opt level: O0

void __thiscall Vector::push(Vector *this,void *ptr,Value v)

{
  Value VVar1;
  long lVar2;
  size_t this_00;
  Type *pTVar3;
  Type *pTVar4;
  ulong uVar5;
  runtime_error *this_01;
  long lVar6;
  reference data;
  Value local_58;
  long local_48;
  size_t size;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *vector_ptr;
  void *local_28;
  void *ptr_local;
  Vector *this_local;
  Value v_local;
  
  v_local.m_data = (void *)v.m_type.t_;
  this_local = (Vector *)v.m_data;
  local_28 = ptr;
  ptr_local = this;
  pTVar3 = Typelib::Value::getType((Value *)&this_local);
  pTVar4 = (Type *)Typelib::Indirect::getIndirection();
  uVar5 = Typelib::Type::operator!=(pTVar3,pTVar4);
  if ((uVar5 & 1) == 0) {
    size = (size_t)local_28;
    local_48 = (**(code **)(*(long *)this + 200))(this,local_28);
    resize(this,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)size,local_48 + 1);
    this_00 = size;
    lVar2 = local_48;
    Typelib::Indirect::getIndirection();
    lVar6 = Typelib::Type::getSize();
    data = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)this_00,lVar2 * lVar6
                     );
    pTVar3 = (Type *)Typelib::Indirect::getIndirection();
    Typelib::Value::Value(&local_58,data,pTVar3);
    VVar1.m_type.t_ = (Type *)v_local.m_data;
    VVar1.m_data = this_local;
    Typelib::copy(local_58,VVar1);
    return;
  }
  this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_01,"type mismatch in vector insertion");
  __cxa_throw(this_01,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void Vector::push(void* ptr, Value v) const
{
    if (v.getType() != getIndirection())
        throw std::runtime_error("type mismatch in vector insertion");

    std::vector<uint8_t>* vector_ptr =
        reinterpret_cast< std::vector<uint8_t>* >(ptr);

    size_t size = getElementCount(ptr);
    resize(vector_ptr, size + 1);
    Typelib::copy(
            Value(&(*vector_ptr)[size * getIndirection().getSize()], getIndirection()),
            v);
}